

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<boost::optional<int>,_void>::deserialize<InputStream>
               (optional<int> *opt,InputStream *istream)

{
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    opt->super_type = (type)0x0;
  }
  else {
    (opt->super_type).m_storage = 0;
    (opt->super_type).m_initialized = true;
    std::istream::read((char *)istream->stream,(long)&(opt->super_type).m_storage);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }